

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O0

JointPolicyPureVectorForClusteredBG * __thiscall
JointPolicyPureVectorForClusteredBG::operator=
          (JointPolicyPureVectorForClusteredBG *this,JointPolicyPureVectorForClusteredBG *o)

{
  JointPolicyPureVectorForClusteredBG *in_RSI;
  JointPolicyPureVectorForClusteredBG *in_RDI;
  JointPolicyPureVectorForClusteredBG *this_00;
  undefined8 local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    this_00 = in_RDI;
    boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator=
              ((shared_ptr<const_BayesianGameWithClusterInfo> *)in_RDI,
               (shared_ptr<const_BayesianGameWithClusterInfo> *)in_RSI);
    boost::shared_ptr<const_JointPolicyPureVectorForClusteredBG>::operator=
              ((shared_ptr<const_JointPolicyPureVectorForClusteredBG> *)this_00,
               (shared_ptr<const_JointPolicyPureVectorForClusteredBG> *)in_RSI);
    PartialJointPolicyPureVector::operator=
              (&in_RSI->super_PartialJointPolicyPureVector,
               &in_RDI->super_PartialJointPolicyPureVector);
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

JointPolicyPureVectorForClusteredBG& JointPolicyPureVectorForClusteredBG::operator= (const JointPolicyPureVectorForClusteredBG& o)
{
#if DEBUG_JPOLASSIGN 
    cerr << "JointPolicyPureVectorForClusteredBG& JointPolicyPureVectorForClusteredBG::operator= (const JointPolicyPureVectorForClusteredBG& o) called"<<endl;
#endif
    if (this == &o) return *this;   // Gracefully handle self assignment
    // Put the normal assignment duties here...
    _m_bg = o._m_bg;
    _m_prevJPolBG = o._m_prevJPolBG;
    
    //call base class assignment:
    PartialJointPolicyPureVector::operator= ( o );
    return *this;
}